

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O0

int ARGBGray(uint8_t *dst_argb,int dst_stride_argb,int dst_x,int dst_y,int width,int height)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  uint in_R8D;
  int in_R9D;
  uint8_t *dst;
  _func_void_uint8_t_ptr_uint8_t_ptr_int *ARGBGrayRow;
  int y;
  long local_38;
  code *pcVar2;
  int local_28;
  int local_24;
  uint local_20;
  int local_14;
  int local_4;
  
  pcVar2 = ARGBGrayRow_C;
  local_38 = in_RDI + in_ECX * in_ESI + (long)(in_EDX << 2);
  if ((((in_RDI == 0) || ((int)in_R8D < 1)) || (in_R9D < 1)) || ((in_EDX < 0 || (in_ECX < 0)))) {
    local_4 = -1;
  }
  else {
    local_24 = in_R9D;
    local_20 = in_R8D;
    local_14 = in_ESI;
    if (in_ESI == in_R8D << 2) {
      local_20 = in_R9D * in_R8D;
      local_24 = 1;
      local_14 = 0;
    }
    iVar1 = libyuv::TestCpuFlag(0);
    if ((iVar1 != 0) && ((local_20 & 7) == 0)) {
      pcVar2 = ARGBGrayRow_SSSE3;
    }
    for (local_28 = 0; local_28 < local_24; local_28 = local_28 + 1) {
      (*pcVar2)(local_38,local_38,local_20);
      local_38 = local_38 + local_14;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

LIBYUV_API
int ARGBGray(uint8_t* dst_argb,
             int dst_stride_argb,
             int dst_x,
             int dst_y,
             int width,
             int height) {
  int y;
  void (*ARGBGrayRow)(const uint8_t* src_argb, uint8_t* dst_argb, int width) =
      ARGBGrayRow_C;
  uint8_t* dst = dst_argb + dst_y * dst_stride_argb + dst_x * 4;
  if (!dst_argb || width <= 0 || height <= 0 || dst_x < 0 || dst_y < 0) {
    return -1;
  }
  // Coalesce rows.
  if (dst_stride_argb == width * 4) {
    width *= height;
    height = 1;
    dst_stride_argb = 0;
  }
#if defined(HAS_ARGBGRAYROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3) && IS_ALIGNED(width, 8)) {
    ARGBGrayRow = ARGBGrayRow_SSSE3;
  }
#endif
#if defined(HAS_ARGBGRAYROW_NEON)
  if (TestCpuFlag(kCpuHasNEON) && IS_ALIGNED(width, 8)) {
    ARGBGrayRow = ARGBGrayRow_NEON;
  }
#endif
#if defined(HAS_ARGBGRAYROW_MMI)
  if (TestCpuFlag(kCpuHasMMI) && IS_ALIGNED(width, 2)) {
    ARGBGrayRow = ARGBGrayRow_MMI;
  }
#endif
#if defined(HAS_ARGBGRAYROW_MSA)
  if (TestCpuFlag(kCpuHasMSA) && IS_ALIGNED(width, 8)) {
    ARGBGrayRow = ARGBGrayRow_MSA;
  }
#endif

  for (y = 0; y < height; ++y) {
    ARGBGrayRow(dst, dst, width);
    dst += dst_stride_argb;
  }
  return 0;
}